

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgFrame.c
# Opt level: O0

uint zvgFrameOpen(void)

{
  uint local_c;
  uint err;
  
  local_c = zvgInit();
  if (local_c == 0) {
    local_c = zvgReadDeviceID(&ZvgID);
  }
  if (local_c == 0) {
    local_c = zvgReadMonitorInfo(&ZvgMon);
  }
  if (local_c == 0) {
    local_c = zvgReadSpeedInfo(ZvgSpeeds);
  }
  if (local_c == 0) {
    zvgEncReset();
    zvgEncSetPtr(EncodeBfr);
    if ((ZvgIO.envMonitor & 1) != 0) {
      ZvgENC.encFlags = ZvgENC.encFlags | 1;
    }
    if ((ZvgIO.envMonitor & 2) != 0) {
      ZvgENC.encFlags = ZvgENC.encFlags | 2;
    }
    if ((ZvgIO.envMonitor & 4) != 0) {
      ZvgENC.encFlags = ZvgENC.encFlags | 4;
    }
    if ((ZvgIO.envMonitor & 8) != 0) {
      ZvgENC.encFlags = ZvgENC.encFlags | 8;
    }
    if ((ZvgIO.envMonitor & 0x10) != 0) {
      ZvgENC.encFlags = ZvgENC.encFlags | 0x10;
      zvgEncSetClipNoOverscan();
    }
  }
  if (local_c != 0) {
    zvgClose();
  }
  return local_c;
}

Assistant:

uint zvgFrameOpen( void)
{

	uint	err;

	// look for the ZVG

	err = zvgInit();

	// read IEEE version information data from ZVG

	if (!err)
		err = zvgReadDeviceID( &ZvgID);

	// read Monitor setup information from ZVG

	if (!err)
		err = zvgReadMonitorInfo( &ZvgMon);

	// read Speed table information for ZVG

	if (!err)
		err = zvgReadSpeedInfo( ZvgSpeeds);

	// reset the ZVG encoder, point to encoder scratch buffer

	if (!err)
	{	zvgEncReset();							// reset ZVG encoder
		zvgEncSetPtr( EncodeBfr);					// point to local encode buffer

		// move monitor flags from environment variable to encoder flags

		if (ZvgIO.envMonitor & MONF_FLIPX)
			ZvgENC.encFlags |= ENCF_FLIPX;

		if (ZvgIO.envMonitor & MONF_FLIPY)
			ZvgENC.encFlags |= ENCF_FLIPY;

		if (ZvgIO.envMonitor & MONF_SPOTKILL)
			ZvgENC.encFlags |= ENCF_SPOTKILL;

		if (ZvgIO.envMonitor & MONF_BW)
			ZvgENC.encFlags |= ENCF_BW;

		if (ZvgIO.envMonitor & MONF_NOOVS)
		{	ZvgENC.encFlags |= ENCF_NOOVS;
			zvgEncSetClipNoOverscan();
		}
	}

	if (err)
		zvgClose();										// if any error occurred, fix everything

	return (err);
}